

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O0

int WebPWriteBMP(FILE *fout,WebPDecBuffer *buffer)

{
  size_t sVar1;
  long in_RSI;
  FILE *in_RDI;
  uint8_t zeroes [3];
  uint8_t *src;
  uint8_t bmp_header [70];
  uint32_t total_size;
  uint32_t bmp_stride;
  uint32_t image_size;
  uint32_t line_size;
  uint32_t bytes_per_px;
  uint32_t y;
  int stride;
  uint8_t *rgba;
  uint32_t height;
  uint32_t width;
  int header_size;
  int has_alpha;
  uint32_t in_stack_ffffffffffffff5c;
  uint8_t *in_stack_ffffffffffffff60;
  uint8_t local_98 [26];
  uint8_t auStack_7e [2];
  uint8_t auStack_7c [48];
  int local_4c;
  uint local_48;
  int local_44;
  uint local_40;
  int local_3c;
  uint local_38;
  int local_34;
  long local_30;
  uint local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  FILE *local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_98,0,0x46);
  if ((local_10 == (FILE *)0x0) || (local_18 == 0)) {
    local_4 = 0;
  }
  else {
    local_1c = WebPIsAlphaMode(MODE_RGB);
    local_20 = 0;
    if (local_1c != 0) {
      local_20 = 0x10;
    }
    local_20 = local_20 + 0x36;
    local_24 = *(int *)(local_18 + 4);
    local_28 = *(uint *)(local_18 + 8);
    local_30 = *(long *)(local_18 + 0x10);
    local_34 = *(int *)(local_18 + 0x18);
    local_3c = 3;
    if (local_1c != 0) {
      local_3c = 4;
    }
    local_40 = local_3c * local_24;
    local_48 = local_40 + 3 & 0xfffffffc;
    local_44 = local_48 * local_28;
    local_4c = local_44 + local_20;
    if (local_30 == 0) {
      local_4 = 0;
    }
    else {
      PutLE16(local_98,0x4d42);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      PutLE16(auStack_7e,1);
      PutLE16(auStack_7c,local_3c << 3);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      if (local_1c != 0) {
        PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        PutLE32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      }
      sVar1 = fwrite(local_98,(long)local_20,1,local_10);
      if (sVar1 == 1) {
        for (local_38 = 0; local_38 < local_28; local_38 = local_38 + 1) {
          sVar1 = fwrite((void *)(local_30 + (ulong)((local_28 - 1) - local_38) * (long)local_34),
                         (ulong)local_40,1,local_10);
          if (sVar1 != 1) {
            return 0;
          }
          if (local_48 != local_40) {
            memset(&stack0xffffffffffffff5d,0,3);
            sVar1 = fwrite(&stack0xffffffffffffff5d,(ulong)(local_48 - local_40),1,local_10);
            if (sVar1 != 1) {
              return 0;
            }
          }
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int WebPWriteBMP(FILE* fout, const WebPDecBuffer* const buffer) {
  int has_alpha, header_size;
  uint32_t width, height;
  uint8_t* rgba;
  int stride;
  uint32_t y;
  uint32_t bytes_per_px, line_size, image_size, bmp_stride, total_size;
  uint8_t bmp_header[BMP_HEADER_SIZE + BMP_HEADER_ALPHA_EXTRA_SIZE] = { 0 };

  if (fout == NULL || buffer == NULL) return 0;

  has_alpha = WebPIsAlphaMode(buffer->colorspace);
  header_size = BMP_HEADER_SIZE + (has_alpha ? BMP_HEADER_ALPHA_EXTRA_SIZE : 0);
  width = buffer->width;
  height = buffer->height;
  rgba = buffer->u.RGBA.rgba;
  stride = buffer->u.RGBA.stride;
  bytes_per_px = has_alpha ? 4 : 3;
  line_size = bytes_per_px * width;
  bmp_stride = (line_size + 3) & ~3;  // pad to 4
  image_size = bmp_stride * height;
  total_size = image_size + header_size;

  if (rgba == NULL) return 0;

  // bitmap file header
  PutLE16(bmp_header + 0, 0x4d42);                // signature 'BM'
  PutLE32(bmp_header + 2, total_size);            // size including header
  PutLE32(bmp_header + 6, 0);                     // reserved
  PutLE32(bmp_header + 10, header_size);          // offset to pixel array
  // bitmap info header
  PutLE32(bmp_header + 14, header_size - 14);     // DIB header size
  PutLE32(bmp_header + 18, width);                // dimensions
  PutLE32(bmp_header + 22, height);               // no vertical flip
  PutLE16(bmp_header + 26, 1);                    // number of planes
  PutLE16(bmp_header + 28, bytes_per_px * 8);     // bits per pixel
  PutLE32(bmp_header + 30, has_alpha ? 3 : 0);    // BI_BITFIELDS or BI_RGB
  PutLE32(bmp_header + 34, image_size);
  PutLE32(bmp_header + 38, 2400);                 // x pixels/meter
  PutLE32(bmp_header + 42, 2400);                 // y pixels/meter
  PutLE32(bmp_header + 46, 0);                    // number of palette colors
  PutLE32(bmp_header + 50, 0);                    // important color count
  if (has_alpha) {  // BITMAPV3INFOHEADER complement
    PutLE32(bmp_header + 54, 0x00ff0000);         // red mask
    PutLE32(bmp_header + 58, 0x0000ff00);         // green mask
    PutLE32(bmp_header + 62, 0x000000ff);         // blue mask
    PutLE32(bmp_header + 66, 0xff000000);         // alpha mask
  }

  // TODO(skal): color profile

  // write header
  if (fwrite(bmp_header, header_size, 1, fout) != 1) {
    return 0;
  }

  // write pixel array, bottom to top
  for (y = 0; y < height; ++y) {
    const uint8_t* const src = &rgba[(uint64_t)(height - 1 - y) * stride];
    if (fwrite(src, line_size, 1, fout) != 1) {
      return 0;
    }
    // write padding zeroes
    if (bmp_stride != line_size) {
      const uint8_t zeroes[3] = { 0 };
      if (fwrite(zeroes, bmp_stride - line_size, 1, fout) != 1) {
        return 0;
      }
    }
  }
  return 1;
}